

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

char * glfwGetGamepadName(int jid)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWmapping *p_Var3;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/input.c"
                  ,0x4d4,"const char *glfwGetGamepadName(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      p_Var3 = (_GLFWmapping *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar1 = initJoysticks();
      if ((GVar1 == 0) || (_glfw.joysticks[(uint)jid].present == 0)) {
        p_Var3 = (_GLFWmapping *)0x0;
      }
      else {
        p_Var3 = (_GLFWmapping *)0x0;
        iVar2 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
        if (iVar2 != 0) {
          p_Var3 = _glfw.joysticks[(uint)jid].mapping;
        }
      }
    }
    return p_Var3->name;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/input.c"
                ,0x4d5,"const char *glfwGetGamepadName(int)");
}

Assistant:

GLFWAPI const char* glfwGetGamepadName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    if (!js->mapping)
        return NULL;

    return js->mapping->name;
}